

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O0

void __thiscall QCacheItem::writeCompressedData(QCacheItem *this,QFileDevice *device)

{
  QIODevice *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QDataStream out;
  int compressionLevel;
  QByteArray local_40;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  uStack_10 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  uStack_20 = 0xaaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_28,in_RSI);
  compressionLevel = (int)((ulong)in_RSI >> 0x20);
  QBuffer::data();
  qCompress(in_RDI,compressionLevel);
  ::operator<<((QDataStream *)&local_28,&local_40);
  QByteArray::~QByteArray((QByteArray *)0x281dc2);
  QDataStream::~QDataStream((QDataStream *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCacheItem::writeCompressedData(QFileDevice *device) const
{
    QDataStream out(device);

    out << qCompress(data.data());
}